

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_bzip2.c
# Opt level: O0

void test_write_filter_bzip2(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  bool bVar3;
  int use_prog;
  int r;
  int i;
  size_t used2;
  size_t used1;
  char path [16];
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  archive *a;
  archive_entry *ae;
  void *in_stack_ffffffffffffff38;
  int iVar7;
  archive_entry *paVar4;
  archive *paVar5;
  void *pvVar6;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar8;
  uint in_stack_ffffffffffffff44;
  wchar_t in_stack_ffffffffffffff48;
  wchar_t in_stack_ffffffffffffff4c;
  archive *in_stack_ffffffffffffff50;
  archive *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  undefined1 *in_stack_ffffffffffffff80;
  long in_stack_ffffffffffffff88;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [56];
  archive_entry *local_10;
  archive_entry *local_8;
  
  local_48._32_8_ = 2000000;
  local_48._48_8_ = malloc(2000000);
  assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                   in_stack_ffffffffffffff48,
                   (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
  if ((void *)local_48._48_8_ != (void *)0x0) {
    local_48._24_8_ = (char *)0x2710;
    local_48._40_8_ = malloc(10000);
    assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                     in_stack_ffffffffffffff48,
                     (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
    if ((char *)local_48._40_8_ == (char *)0x0) {
      free((void *)local_48._48_8_);
    }
    else {
      memset((void *)local_48._40_8_,0,local_48._24_8_);
      local_10 = (archive_entry *)archive_write_new();
      assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                       in_stack_ffffffffffffff48,
                       (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
      archive_write_set_format_ustar
                ((archive *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      assertion_equal_int((char *)in_stack_ffffffffffffff58,
                          (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (longlong)local_10,(char *)0x1d5dbc,in_stack_ffffffffffffff70);
      wVar1 = archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
      bVar3 = false;
      if (wVar1 == L'\xffffffec') {
        wVar2 = canBzip2();
        bVar3 = wVar2 != L'\0';
      }
      if ((wVar1 == L'\0') || (bVar3)) {
        archive_write_set_bytes_per_block
                  ((archive *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff44);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (longlong)local_10,(char *)0x1d5ec5,in_stack_ffffffffffffff70);
        archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                            ,(int)((ulong)paVar4 >> 0x20));
        iVar7 = 0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),0,
                            (char *)0x1d5f05,in_stack_ffffffffffffff70);
        archive_filter_name((archive *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                            ,iVar7);
        uVar8 = 0;
        assertion_equal_string
                  (in_stack_ffffffffffffff68,(wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                   (char *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (char *)((ulong)in_stack_ffffffffffffff44 << 0x20),in_stack_ffffffffffffff80,
                   (wchar_t)in_stack_ffffffffffffff88);
        archive_write_open_memory
                  (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (size_t *)CONCAT44(in_stack_ffffffffffffff44,uVar8));
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d5fa5,in_stack_ffffffffffffff70);
        archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),
                            (int)((ulong)paVar4 >> 0x20));
        iVar7 = 0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d5fe5,
                            in_stack_ffffffffffffff70);
        archive_filter_name((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),iVar7);
        paVar4 = (archive_entry *)0x0;
        uVar8 = 0;
        assertion_equal_string
                  (in_stack_ffffffffffffff68,(wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                   (char *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (char *)((ulong)in_stack_ffffffffffffff44 << 0x20),in_stack_ffffffffffffff80,
                   (wchar_t)in_stack_ffffffffffffff88);
        local_8 = archive_entry_new();
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,paVar4);
        archive_entry_set_filetype(local_8,0x8000);
        archive_entry_set_size(local_8,local_48._24_8_);
        for (local_5c = 0; (int)local_5c < 999; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          archive_entry_copy_pathname
                    ((archive_entry *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(char *)paVar4);
          archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4);
          paVar4 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d611a,in_stack_ffffffffffffff70);
          archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4,0x1d6144);
          assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                           in_stack_ffffffffffffff48,
                           (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4);
        }
        archive_entry_free((archive_entry *)0x1d6194);
        archive_write_close((archive *)0x1d61a1);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d61d3,in_stack_ffffffffffffff70);
        archive_write_free((archive *)0x1d61e0);
        paVar5 = (archive *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d620e,
                            in_stack_ffffffffffffff70);
        local_10 = (archive_entry *)archive_read_new();
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,paVar5);
        archive_read_support_format_all(paVar5);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6283,in_stack_ffffffffffffff70);
        archive_read_support_filter_all((archive *)paVar4);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d62c2,in_stack_ffffffffffffff70);
        archive_read_open_memory
                  ((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4,0x1d62dc);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d630e,in_stack_ffffffffffffff70);
        for (local_5c = 0; (int)local_5c < 999; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          archive_read_next_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(archive_entry **)paVar4);
          paVar4 = (archive_entry *)0x0;
          wVar1 = assertion_equal_int((char *)in_stack_ffffffffffffff58,
                                      (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                      (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,
                                      (char *)0x1d6381,in_stack_ffffffffffffff70);
          wVar2 = (wchar_t)in_stack_ffffffffffffff88;
          if (wVar1 == L'\0') break;
          in_stack_ffffffffffffff80 = local_48;
          archive_entry_pathname(paVar4);
          uVar8 = 0;
          assertion_equal_string
                    (in_stack_ffffffffffffff68,(wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                     (char *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (char *)((ulong)in_stack_ffffffffffffff44 << 0x20),in_stack_ffffffffffffff80,
                     wVar2);
          in_stack_ffffffffffffff88 = (long)(int)local_48._24_8_;
          archive_entry_size(local_8);
          paVar4 = (archive_entry *)0x0;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d642d,
                              in_stack_ffffffffffffff70);
        }
        archive_read_close((archive *)0x1d644a);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d647c,in_stack_ffffffffffffff70);
        archive_read_free((archive *)0x1d6489);
        pvVar6 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d64b7,
                            in_stack_ffffffffffffff70);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,pvVar6);
        archive_write_set_format_ustar
                  ((archive *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d652c,in_stack_ffffffffffffff70);
        archive_write_set_bytes_per_block
                  ((archive *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff44);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6570,in_stack_ffffffffffffff70);
        if (bVar3) {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          paVar4 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d65b9,in_stack_ffffffffffffff70);
        }
        else {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          paVar4 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d65fa,in_stack_ffffffffffffff70);
        }
        archive_write_set_filter_option
                  (in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(char *)paVar4);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d664e,in_stack_ffffffffffffff70);
        archive_write_set_filter_option
                  (in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(char *)paVar4);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d66a2,in_stack_ffffffffffffff70);
        archive_write_set_filter_option
                  (in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(char *)paVar4);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d66f6,in_stack_ffffffffffffff70);
        archive_write_set_filter_option
                  (in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(char *)paVar4);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6747,in_stack_ffffffffffffff70);
        archive_write_open_memory
                  (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (size_t *)CONCAT44(in_stack_ffffffffffffff44,uVar8));
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d679b,in_stack_ffffffffffffff70);
        for (local_5c = 0; (int)local_5c < 999; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          local_8 = archive_entry_new();
          assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                           in_stack_ffffffffffffff48,
                           (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4);
          archive_entry_copy_pathname
                    ((archive_entry *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(char *)paVar4);
          archive_entry_set_size(local_8,local_48._24_8_);
          archive_entry_set_filetype(local_8,0x8000);
          archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4);
          paVar4 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d6884,in_stack_ffffffffffffff70);
          archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4,0x1d68ae);
          assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                           in_stack_ffffffffffffff48,
                           (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4);
          archive_entry_free((archive_entry *)0x1d68ee);
        }
        archive_write_close((archive *)0x1d690b);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d693d,in_stack_ffffffffffffff70);
        archive_write_free((archive *)0x1d694a);
        paVar5 = (archive *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d6978,
                            in_stack_ffffffffffffff70);
        local_10 = (archive_entry *)archive_read_new();
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,paVar5);
        archive_read_support_format_all(paVar5);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d69ed,in_stack_ffffffffffffff70);
        archive_read_support_filter_all((archive *)paVar4);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6a2c,in_stack_ffffffffffffff70);
        archive_read_open_memory
                  ((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4,0x1d6a46);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6a78,in_stack_ffffffffffffff70);
        for (local_5c = 0; (int)local_5c < 999; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          archive_read_next_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(archive_entry **)paVar4);
          paVar4 = (archive_entry *)0x0;
          wVar1 = assertion_equal_int((char *)in_stack_ffffffffffffff58,
                                      (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                      (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,
                                      (char *)0x1d6aeb,in_stack_ffffffffffffff70);
          if (wVar1 == L'\0') break;
          in_stack_ffffffffffffff68 = local_48;
          archive_entry_pathname(paVar4);
          uVar8 = 0;
          assertion_equal_string
                    (in_stack_ffffffffffffff68,(wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                     (char *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (char *)((ulong)in_stack_ffffffffffffff44 << 0x20),in_stack_ffffffffffffff80,
                     (wchar_t)in_stack_ffffffffffffff88);
          in_stack_ffffffffffffff70 = (void *)(long)(int)local_48._24_8_;
          archive_entry_size(local_8);
          paVar4 = (archive_entry *)0x0;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d6b97,
                              in_stack_ffffffffffffff70);
        }
        archive_read_close((archive *)0x1d6bb4);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6be6,in_stack_ffffffffffffff70);
        archive_read_free((archive *)0x1d6bf3);
        pvVar6 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d6c21,
                            in_stack_ffffffffffffff70);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,pvVar6);
        archive_write_set_format_ustar
                  ((archive *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6c96,in_stack_ffffffffffffff70);
        archive_write_set_bytes_per_block
                  ((archive *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff44);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6cda,in_stack_ffffffffffffff70);
        if (bVar3) {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          paVar4 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d6d23,in_stack_ffffffffffffff70);
        }
        else {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          paVar4 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d6d64,in_stack_ffffffffffffff70);
        }
        archive_write_set_filter_option
                  (in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(char *)paVar4);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6db5,in_stack_ffffffffffffff70);
        archive_write_open_memory
                  (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (size_t *)CONCAT44(in_stack_ffffffffffffff44,uVar8));
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6e09,in_stack_ffffffffffffff70);
        for (local_5c = 0; (int)local_5c < 999; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          local_8 = archive_entry_new();
          assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                           in_stack_ffffffffffffff48,
                           (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4);
          archive_entry_copy_pathname
                    ((archive_entry *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(char *)paVar4);
          archive_entry_set_size(local_8,local_48._24_8_);
          archive_entry_set_filetype(local_8,0x8000);
          archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4);
          paVar4 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d6ef2,in_stack_ffffffffffffff70);
          failure("Writing file %s",local_48);
          in_stack_ffffffffffffff60 = (char *)local_48._24_8_;
          archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4,0x1d6f32);
          paVar4 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d6f65,in_stack_ffffffffffffff70);
          archive_entry_free((archive_entry *)0x1d6f72);
        }
        archive_write_close((archive *)0x1d6f8f);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d6fc1,in_stack_ffffffffffffff70);
        archive_write_free((archive *)0x1d6fce);
        paVar5 = (archive *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d6ffc,
                            in_stack_ffffffffffffff70);
        failure("Compression-level=0 wrote %d bytes; default wrote %d bytes",local_58 & 0xffffffff,
                local_50 & 0xffffffff);
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,paVar5);
        local_10 = (archive_entry *)archive_read_new();
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,paVar5);
        archive_read_support_format_all(paVar5);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d70bc,in_stack_ffffffffffffff70);
        archive_read_support_filter_all((archive *)paVar4);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d70fb,in_stack_ffffffffffffff70);
        archive_read_open_memory
                  ((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),paVar4,0x1d7115);
        paVar4 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d7147,in_stack_ffffffffffffff70);
        for (local_5c = 0; (int)local_5c < 999; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          archive_read_next_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(archive_entry **)paVar4);
          paVar4 = (archive_entry *)0x0;
          wVar1 = assertion_equal_int((char *)in_stack_ffffffffffffff58,
                                      (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                      (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,
                                      (char *)0x1d71ba,in_stack_ffffffffffffff70);
          if (wVar1 == L'\0') break;
          in_stack_ffffffffffffff50 = (archive *)local_48;
          archive_entry_pathname(paVar4);
          uVar8 = 0;
          assertion_equal_string
                    (in_stack_ffffffffffffff68,(wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                     (char *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (char *)((ulong)in_stack_ffffffffffffff44 << 0x20),in_stack_ffffffffffffff80,
                     (wchar_t)in_stack_ffffffffffffff88);
          in_stack_ffffffffffffff58 = (archive *)(long)(int)local_48._24_8_;
          archive_entry_size(local_8);
          paVar4 = (archive_entry *)0x0;
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d7266,
                              in_stack_ffffffffffffff70);
        }
        archive_read_close((archive *)0x1d7283);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d72b5,in_stack_ffffffffffffff70);
        archive_read_free((archive *)0x1d72c2);
        pvVar6 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d72f0,
                            in_stack_ffffffffffffff70);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,pvVar6);
        if (bVar3) {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d736f,in_stack_ffffffffffffff70);
        }
        else {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d73b0,in_stack_ffffffffffffff70);
        }
        archive_write_free((archive *)0x1d73bd);
        pvVar6 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d73eb,
                            in_stack_ffffffffffffff70);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,pvVar6);
        if (bVar3) {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d746a,in_stack_ffffffffffffff70);
        }
        else {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d74ab,in_stack_ffffffffffffff70);
        }
        archive_write_close((archive *)0x1d74b8);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d74e6,
                            in_stack_ffffffffffffff70);
        archive_write_free((archive *)0x1d74f3);
        pvVar6 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d7521,
                            in_stack_ffffffffffffff70);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,pvVar6);
        archive_write_set_format_ustar
                  ((archive *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d7596,in_stack_ffffffffffffff70);
        if (bVar3) {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d75df,in_stack_ffffffffffffff70);
        }
        else {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d7620,in_stack_ffffffffffffff70);
        }
        archive_write_close((archive *)0x1d762d);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d765b,
                            in_stack_ffffffffffffff70);
        archive_write_free((archive *)0x1d7668);
        pvVar6 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d7696,
                            in_stack_ffffffffffffff70);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,(char *)CONCAT44(in_stack_ffffffffffffff44,uVar8)
                         ,pvVar6);
        archive_write_set_format_ustar
                  ((archive *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        assertion_equal_int((char *)in_stack_ffffffffffffff58,
                            (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d770b,in_stack_ffffffffffffff70);
        if (bVar3) {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d7754,in_stack_ffffffffffffff70);
        }
        else {
          archive_write_add_filter_bzip2(in_stack_ffffffffffffff58);
          assertion_equal_int((char *)in_stack_ffffffffffffff58,
                              (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                              (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                              (char *)0x1d7795,in_stack_ffffffffffffff70);
        }
        archive_write_open_memory
                  (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (size_t *)CONCAT44(in_stack_ffffffffffffff44,uVar8));
        wVar1 = (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,wVar1,
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),(longlong)local_10,
                            (char *)0x1d77e9,in_stack_ffffffffffffff70);
        archive_write_close((archive *)0x1d77f6);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,wVar1,
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d7824,
                            in_stack_ffffffffffffff70);
        archive_write_free((archive *)0x1d7831);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,wVar1,
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,uVar8),0,(char *)0x1d785f,
                            in_stack_ffffffffffffff70);
        free((void *)local_48._40_8_);
        free((void *)local_48._48_8_);
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_bzip2.c"
                       ,L'C');
        wVar1 = (wchar_t)((ulong)in_stack_ffffffffffffff50 >> 0x20);
        test_skipping("bzip2 writing not supported on this platform");
        archive_write_free((archive *)0x1d5e34);
        assertion_equal_int((char *)in_stack_ffffffffffffff58,wVar1,
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),0,
                            (char *)0x1d5e62,in_stack_ffffffffffffff70);
        free((void *)local_48._48_8_);
        free((void *)local_48._40_8_);
      }
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_bzip2)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i, r, use_prog;

	buffsize = 2000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_bzip2(a);
	use_prog = (r == ARCHIVE_WARN && canBzip2());
	if (r != ARCHIVE_OK && !use_prog) {
		skipping("bzip2 writing not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}

	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_BZIP2, archive_filter_code(a, 0));
	assertEqualString("bzip2", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assertEqualInt(ARCHIVE_FILTER_BZIP2, archive_filter_code(a, 0));
	assertEqualString("bzip2", archive_filter_name(a, 0));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used1));
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		if (!assertEqualInt(0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_set_filter_option(a,
	    NULL, "nonexistent-option", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_set_filter_option(a,
	    NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_set_filter_option(a,
	    NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_filter_option(a,
	    NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data,
		    datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Curiously, this test fails; the test data above compresses
	 * better at default compression than at level 9. */
	/*
	failure("compression-level=9 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);
	*/

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used2));
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		if (!assertEqualInt(0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with much lower compression.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_filter_option(a,
	    NULL, "compression-level", "1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Level 0 really does result in larger data. */
	failure("Compression-level=0 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used2));
	for (i = 0; i < 999; i++) {
		sprintf(path, "file%03d", i);
		if (!assertEqualInt(0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	if (use_prog)
		assertEqualIntA(a, ARCHIVE_WARN,
		    archive_write_add_filter_bzip2(a));
	else
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_bzip2(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}